

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

SingleOperationStatistics * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::
calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>>
          (SingleOperationStatistics *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
          *samples,offset_in_SampleType_to_deUint64 target)

{
  long lVar1;
  long lVar2;
  ulong *puVar3;
  long lVar4;
  float fVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  allocator_type local_39;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
             *(long *)(this + 8) - *(long *)this >> 6,&local_39);
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  puVar3 = (ulong *)((long)&(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar1);
  for (lVar4 = 0; lVar4 < (int)((ulong)(lVar2 - lVar1) >> 6); lVar4 = lVar4 + 1) {
    local_38._M_impl.super__Vector_impl_data._M_start[lVar4] = *puVar3;
    puVar3 = puVar3 + 8;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_38._M_impl.super__Vector_impl_data._M_start,
             local_38._M_impl.super__Vector_impl_data._M_finish);
  __return_storage_ptr__->minTime = (float)*local_38._M_impl.super__Vector_impl_data._M_start;
  __return_storage_ptr__->maxTime = (float)local_38._M_impl.super__Vector_impl_data._M_finish[-1];
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,0.5);
  __return_storage_ptr__->medianTime = fVar5;
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,0.1);
  __return_storage_ptr__->min2DecileTime = fVar5;
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,0.9);
  __return_storage_ptr__->max9DecileTime = fVar5;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

SingleOperationStatistics calculateSingleOperationStatistics (const std::vector<T>& samples, deUint64 T::SampleType::*target)
{
	SingleOperationStatistics	stats;
	std::vector<deUint64>		values(samples.size());

	for (int ndx = 0; ndx < (int)samples.size(); ++ndx)
		values[ndx] = samples[ndx].duration.*target;

	std::sort(values.begin(), values.end());

	stats.minTime			= (float)values.front();
	stats.maxTime			= (float)values.back();
	stats.medianTime		= linearSample(values, 0.5f);
	stats.min2DecileTime	= linearSample(values, 0.1f);
	stats.max9DecileTime	= linearSample(values, 0.9f);

	return stats;
}